

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.h
# Opt level: O1

void __thiscall BasicBlock::BasicBlock(BasicBlock *this,JitArenaAllocator *alloc,Func *func)

{
  this->next = (BasicBlock *)0x0;
  this->prev = (BasicBlock *)0x0;
  this->loop = (Loop *)0x0;
  *(ushort *)&this->field_0x18 = *(ushort *)&this->field_0x18 & 0xf020;
  (this->globOptData).symToValueMap = (GlobHashTable *)0x0;
  (this->globOptData).exprToValueMap = (ExprHashTable *)0x0;
  (this->globOptData).liveFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->globOptData).liveArrayValues = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->globOptData).maybeWrittenTypeSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->globOptData).liveVarSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->globOptData).liveInt32Syms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->globOptData).liveLossyInt32Syms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->globOptData).liveFloat64Syms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->globOptData).argObjSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->globOptData).maybeTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->globOptData).canStoreTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  memset(&this->liveFixedFields,0,0xa8);
  (this->globOptData).curFunc = func;
  (this->globOptData).hasCSECandidates = false;
  (this->globOptData).valuesToKillOnCalls = (ValueSet *)0x0;
  (this->globOptData).inductionVariables = (InductionVariableSet *)0x0;
  (this->globOptData).availableIntBoundChecks = (IntBoundCheckSet *)0x0;
  (this->globOptData).startCallCount = 0;
  (this->globOptData).argOutCount = 0;
  (this->globOptData).totalOutParamCount = 0;
  (this->globOptData).callSequence = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0
  ;
  (this->globOptData).stackLiteralInitFldDataMap = (StackLiteralInitFldDataMap *)0x0;
  (this->globOptData).capturedValuesCandidate = (CapturedValues *)0x0;
  (this->globOptData).capturedValues = (CapturedValues *)0x0;
  (this->globOptData).changedSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
  count = 0;
  (this->globOptData).hasDataRef = (bool *)0x0;
  (this->globOptData).globOpt = (GlobOpt *)0x0;
  this->byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->byteCodeRestoreSyms = (StackSym **)0x0;
  this->intOverflowDoesNotMatterRange = (IntOverflowDoesNotMatterRange *)0x0;
  this->firstInstr = (Instr *)0x0;
  (this->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->predList;
  (this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
  count = 0;
  (this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->succList;
  (this->deadPredList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_RealCount.count = 0;
  (this->deadPredList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->deadPredList;
  (this->deadSuccList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_RealCount.count = 0;
  (this->deadSuccList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->deadSuccList;
  this->func = func;
  this->number = 0xffffffff;
  this->dataUseCount = 0;
  return;
}

Assistant:

BasicBlock(JitArenaAllocator * alloc, Func *func) :
        next(nullptr),
        prev(nullptr),
        firstInstr(nullptr),
        number(k_InvalidNum),
        loop(nullptr),
        isDeleted(false),
        isDead(false),
        isLoopHeader(false),
        hasCall(false),
        hasYield(false),
        liveFixedFields(nullptr),
        upwardExposedUses(nullptr),
        upwardExposedFields(nullptr),
        typesNeedingKnownObjectLayout(nullptr),
        slotDeadStoreCandidates(nullptr),
        tempNumberTracker(nullptr),
        tempObjectTracker(nullptr),
#if DBG
        tempObjectVerifyTracker(nullptr),
#endif
        stackSymToFinalType(nullptr),
        stackSymToGuardedProperties(nullptr),
        stackSymToWriteGuardsMap(nullptr),
        typeIDsWithFinalType(nullptr),
        noImplicitCallUses(nullptr),
        noImplicitCallNoMissingValuesUses(nullptr),
        noImplicitCallNativeArrayUses(nullptr),
        noImplicitCallJsArrayHeadSegmentSymUses(nullptr),
        noImplicitCallArrayLengthSymUses(nullptr),
        cloneStrCandidates(nullptr),
        couldRemoveNegZeroBailoutForDef(nullptr),
        byteCodeUpwardExposedUsed(nullptr),
        isAirLockCompensationBlock(false),
        beginsBailOnNoProfile(false),
#if DBG
        byteCodeRestoreSyms(nullptr),
        isBreakBlock(false),
        isAirLockBlock(false),
        isBreakCompensationBlockAtSource(false),
        isBreakCompensationBlockAtSink(false),
#endif
        dataUseCount(0),
        intOverflowDoesNotMatterRange(nullptr),
        func(func),
        globOptData(func)
    {
    }